

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_protection_heat_cold(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  CHAR_DATA *in_RDI;
  int chance;
  AFFECT_DATA af;
  AFFECT_DATA *paf;
  CHAR_DATA *in_stack_ffffffffffffff88;
  char_data *in_stack_ffffffffffffff90;
  
  iVar2 = get_skill(ch,argument._4_4_);
  if (iVar2 != 0) {
    iVar3 = (int)in_RDI->level;
    paf = (AFFECT_DATA *)(skill_table + gsn_protection_heat_cold);
    this = char_data::Class(in_stack_ffffffffffffff90);
    iVar4 = CClass::GetIndex(this);
    if (*(short *)((long)paf->bitvector + (long)iVar4 * 2 + -0x20) <= iVar3) {
      bVar1 = is_affected(in_RDI,(int)gsn_protection_heat_cold);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        return;
      }
      iVar4 = number_percent();
      if (iVar2 < iVar4) {
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                      af.tick_fun._4_4_);
        return;
      }
      init_affect((AFFECT_DATA *)0x5ef6cc);
      std::pow<int,int>(0,0x5ef728);
      std::pow<int,int>(0,0x5ef746);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar2,iVar3),paf);
      send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,af.tick_fun._4_4_)
      ;
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void do_protection_heat_cold(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int chance;
	chance = get_skill(ch, gsn_protection_heat_cold);

	if (chance == 0 || ch->level < skill_table[gsn_protection_heat_cold].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to protect yourself from the elements.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_protection_heat_cold))
	{
		send_to_char("You are already protected from the elements.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		send_to_char("You try to protect yourself from the elements but fail.\n\r", ch);
		check_improve(ch, gsn_protection_heat_cold, false, 1);
		return;
	}

	init_affect(&af);
	af.where = TO_RESIST;
	af.aftype = AFT_SKILL;
	af.type = gsn_protection_heat_cold;
	af.level = ch->level;
	af.modifier = 0;
	af.duration = ch->level;

	SET_BIT(af.bitvector, RES_FIRE);
	SET_BIT(af.bitvector, RES_COLD);

	af.location = 0;
	af.mod_name = MOD_RESISTANCE;
	affect_to_char(ch, &af);

	send_to_char("You are protected from the elements.\n\r", ch);
	check_improve(ch, gsn_protection_heat_cold, true, 1);
}